

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# telnet.c
# Opt level: O2

void telnet_send(Backend *be,char *buf,size_t len)

{
  Interactor *pIVar1;
  long lVar2;
  char *pcVar3;
  char *pcVar4;
  uchar *puVar5;
  
  if (be[-10].vt != (BackendVtable *)0x0) {
    pcVar3 = buf + len;
LAB_00138b16:
    if (buf < pcVar3) {
      lVar2 = 0;
      while (((pcVar4 = buf + lVar2, pcVar4 < pcVar3 && (*pcVar4 != -1)) &&
             ((*pcVar4 != '\r' || (*(int *)&be[-5].interactor == 1))))) {
        lVar2 = lVar2 + 1;
      }
      pIVar1 = (Interactor *)(**(code **)((be[-10].vt)->init + 0x10))();
      be[-4].interactor = pIVar1;
      for (; buf = pcVar4, pcVar4 < pcVar3; pcVar4 = pcVar4 + 1) {
        puVar5 = telnet_send::iac;
        if ((*pcVar4 != -1) &&
           ((*pcVar4 != '\r' || (puVar5 = "\r", *(int *)&be[-5].interactor == 1)))) break;
        pIVar1 = (Interactor *)(**(code **)((be[-10].vt)->init + 0x10))(be[-10].vt,puVar5,2);
        be[-4].interactor = pIVar1;
      }
      goto LAB_00138b16;
    }
  }
  return;
}

Assistant:

static void telnet_send(Backend *be, const char *buf, size_t len)
{
    Telnet *telnet = container_of(be, Telnet, backend);
    unsigned char *p, *end;
    static const unsigned char iac[2] = { IAC, IAC };
    static const unsigned char cr[2] = { CR, NUL };
#if 0
    static const unsigned char nl[2] = { CR, LF };
#endif

    if (telnet->s == NULL)
        return;

    p = (unsigned char *)buf;
    end = (unsigned char *)(buf + len);
    while (p < end) {
        unsigned char *q = p;

        while (p < end && iswritable(*p))
            p++;
        telnet->bufsize = sk_write(telnet->s, q, p - q);

        while (p < end && !iswritable(*p)) {
            telnet->bufsize =
                sk_write(telnet->s, *p == IAC ? iac : cr, 2);
            p++;
        }
    }
}